

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2shape_index_region.h
# Opt level: O3

bool __thiscall
S2ShapeIndexRegion<MutableS2ShapeIndex>::AnyEdgeIntersects
          (S2ShapeIndexRegion<MutableS2ShapeIndex> *this,S2ClippedShape *clipped,S2Cell *target)

{
  char cVar1;
  __uniq_ptr_data<S2Shape,_std::default_delete<S2Shape>,_true,_true> _Var2;
  bool bVar3;
  anon_union_8_2_2d159a09_for_S2ClippedShape_3 *paVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  bool bVar8;
  R2Point p0;
  R2Point p1;
  Edge edge;
  R2Rect bound;
  R2Point local_a8;
  R2Point local_98;
  undefined1 local_88 [56];
  R2Rect local_50;
  
  if (AnyEdgeIntersects(S2ClippedShape_const&,S2Cell_const&)::kMaxError == '\0') {
    AnyEdgeIntersects();
  }
  local_88._0_8_ = (target->uv_).bounds_[0].bounds_.c_[0];
  local_88._8_8_ = (target->uv_).bounds_[0].bounds_.c_[1];
  local_88._16_8_ = (target->uv_).bounds_[1].bounds_.c_[0];
  local_88._24_8_ = (target->uv_).bounds_[1].bounds_.c_[1];
  local_a8.c_[0] = AnyEdgeIntersects::kMaxError;
  local_a8.c_[1] = AnyEdgeIntersects::kMaxError;
  R2Rect::Expanded((R2Rect *)local_88,&local_a8);
  if (1 < *(uint *)&clipped->field_0x4) {
    cVar1 = target->face_;
    _Var2.super___uniq_ptr_impl<S2Shape,_std::default_delete<S2Shape>_>._M_t.
    super__Tuple_impl<0UL,_S2Shape_*,_std::default_delete<S2Shape>_>.
    super__Head_base<0UL,_S2Shape_*,_false>._M_head_impl =
         (((this->contains_query_).index_)->shapes_).
         super__Vector_base<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start[clipped->shape_id_]._M_t.
         super___uniq_ptr_impl<S2Shape,_std::default_delete<S2Shape>_>;
    uVar5 = (ulong)(*(uint *)&clipped->field_0x4 >> 1);
    bVar8 = true;
    uVar6 = 1;
    lVar7 = 0;
    do {
      paVar4 = &clipped->field_3;
      if (5 < *(uint *)&clipped->field_0x4) {
        paVar4 = (anon_union_8_2_2d159a09_for_S2ClippedShape_3 *)(clipped->field_3).edges_;
      }
      (**(code **)(*(long *)_Var2.super___uniq_ptr_impl<S2Shape,_std::default_delete<S2Shape>_>._M_t
                            .super__Tuple_impl<0UL,_S2Shape_*,_std::default_delete<S2Shape>_>.
                            super__Head_base<0UL,_S2Shape_*,_false>._M_head_impl + 0x18))
                ((S2Point *)local_88,
                 _Var2.super___uniq_ptr_impl<S2Shape,_std::default_delete<S2Shape>_>._M_t.
                 super__Tuple_impl<0UL,_S2Shape_*,_std::default_delete<S2Shape>_>.
                 super__Head_base<0UL,_S2Shape_*,_false>._M_head_impl,
                 *(undefined4 *)((long)paVar4 + lVar7));
      local_a8.c_[0] = 0.0;
      local_a8.c_[1] = 0.0;
      local_98.c_[0] = 0.0;
      local_98.c_[1] = 0.0;
      bVar3 = S2::ClipToPaddedFace
                        ((S2Point *)local_88,(S2Point *)(local_88 + 0x18),(int)cVar1,
                         AnyEdgeIntersects::kMaxError,&local_a8,&local_98);
      if ((bVar3) && (bVar3 = S2::IntersectsRect(&local_a8,&local_98,&local_50), bVar3)) {
        return bVar8;
      }
      bVar8 = uVar6 < uVar5;
      lVar7 = lVar7 + 4;
      uVar6 = uVar6 + 1;
    } while (uVar5 * 4 != lVar7);
  }
  return false;
}

Assistant:

bool S2ShapeIndexRegion<IndexType>::AnyEdgeIntersects(
    const S2ClippedShape& clipped, const S2Cell& target) const {
  static const double kMaxError = (S2::kFaceClipErrorUVCoord +
                                   S2::kIntersectsRectErrorUVDist);
  const R2Rect bound = target.GetBoundUV().Expanded(kMaxError);
  const int face = target.face();
  const S2Shape& shape = *index().shape(clipped.shape_id());
  const int num_edges = clipped.num_edges();
  for (int i = 0; i < num_edges; ++i) {
    const auto edge = shape.edge(clipped.edge(i));
    R2Point p0, p1;
    if (S2::ClipToPaddedFace(edge.v0, edge.v1, face, kMaxError, &p0, &p1) &&
        S2::IntersectsRect(p0, p1, bound)) {
      return true;
    }
  }
  return false;
}